

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_base.cpp
# Opt level: O1

void __thiscall ximu::WriterBase::sendWriteDateTimePacket(WriterBase *this,DateTimeData *d)

{
  void *pvStack_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  
  pvStack_28 = (void *)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PacketConstruction::
  constructWriteDateTimePacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (d,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pvStack_28);
  (**this->_vptr_WriterBase)(this,&pvStack_28);
  if (pvStack_28 != (void *)0x0) {
    operator_delete(pvStack_28);
  }
  return;
}

Assistant:

void WriterBase::sendWriteDateTimePacket(DateTimeData& d) {
  std::vector<unsigned char> buffer;
  PacketConstruction::constructWriteDateTimePacket(
      d, back_inserter(buffer));
  sendSerialBuffer(buffer);
}